

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

ImPlotPoint ValueGetter::getValue<float,double>(void *data,int idx)

{
  double y;
  double x;
  ValueGetter *this_;
  int idx_local;
  void *data_local;
  
  ImPlotPoint::ImPlotPoint
            ((ImPlotPoint *)&data_local,
             (double)*(float *)(*(long *)((long)data + 8) + (long)idx * 4),
             *(double *)(*(long *)((long)data + 0x90) + (long)idx * 8));
  return _data_local;
}

Assistant:

static ImPlotPoint getValue(void* data, int idx) {
    const auto* this_ = static_cast<ValueGetter*>(data);
    double x, y;
    if constexpr (std::is_void<X>::value) {
      x = static_cast<double>(idx);
    } else {
      x = static_cast<double>((static_cast<X*>(this_->infoX.ptr))[idx]);
    }
    y = static_cast<double>((static_cast<Y*>(this_->infoY.ptr))[idx]);
    return ImPlotPoint(x, y);
  }